

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  Dring *pDVar10;
  long lVar11;
  int *piVar12;
  
  pCVar1 = &(this->u).col;
  piVar4 = (this->u).col.idx;
  piVar5 = (this->u).col.start;
  piVar6 = (this->u).col.len;
  piVar7 = (this->u).col.max;
  iVar8 = 0;
  pDVar10 = &pCVar1->list;
  while (pDVar10 = ((Dring *)&pDVar10->next)->next, (Col *)pDVar10 != pCVar1) {
    iVar2 = pDVar10->idx;
    if (piVar5[iVar2] != iVar8) goto LAB_003141c0;
    iVar3 = piVar6[iVar2];
    iVar8 = iVar8 + iVar3;
    piVar7[iVar2] = iVar3;
  }
LAB_003141fd:
  (this->u).col.used = iVar8;
  piVar7[this->thedim] = 0;
  return;
LAB_003141c0:
  do {
    iVar2 = pDVar10->idx;
    lVar11 = (long)piVar5[iVar2];
    piVar5[iVar2] = iVar8;
    iVar3 = piVar6[iVar2];
    piVar7[iVar2] = iVar3;
    lVar9 = iVar3 + lVar11;
    piVar12 = piVar4 + iVar8;
    for (; lVar11 < lVar9; lVar11 = lVar11 + 1) {
      *piVar12 = piVar4[lVar11];
      iVar8 = iVar8 + 1;
      piVar12 = piVar12 + 1;
    }
    pDVar10 = pDVar10->next;
  } while ((Col *)pDVar10 != pCVar1);
  goto LAB_003141fd;
}

Assistant:

void CLUFactor<R>::packColumns()
{
   int n, i, j, l_col;
   Dring* ring, *list;

   int* l_cidx = u.col.idx;
   int* l_clen = u.col.len;
   int* l_cmax = u.col.max;
   int* l_cbeg = u.col.start;

   n = 0;
   list = &(u.col.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_col = ring->idx;

      if(l_cbeg[l_col] != n)
      {
         do
         {
            l_col = ring->idx;
            i = l_cbeg[l_col];
            l_cbeg[l_col] = n;
            l_cmax[l_col] = l_clen[l_col];
            j = i + l_clen[l_col];

            for(; i < j; ++i)
               l_cidx[n++] = l_cidx[i];

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += l_clen[l_col];

      l_cmax[l_col] = l_clen[l_col];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}